

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-inotify.c
# Opt level: O2

int uv_fs_event_stop(uv_fs_event_t *handle)

{
  uint *puVar1;
  uint uVar2;
  uv_loop_t *loop;
  void *pvVar3;
  int iVar4;
  undefined4 uVar5;
  watcher_list *pwVar6;
  watcher_list *__ptr;
  void **ppvVar7;
  watcher_list *pwVar8;
  watcher_list *pwVar9;
  watcher_list *pwVar10;
  int iVar11;
  watcher_list *pwVar12;
  void **ppvVar13;
  watcher_list *pwVar14;
  watcher_list *old;
  
  uVar2 = handle->flags;
  if ((uVar2 >> 0xe & 1) == 0) {
    return -0x16;
  }
  loop = handle->loop;
  __ptr = find_watcher(loop,handle->wd);
  if (__ptr == (watcher_list *)0x0) {
    __assert_fail("w != NULL","src/unix/linux-inotify.c",0xed,
                  "int uv_fs_event_stop(uv_fs_event_t *)");
  }
  handle->wd = -1;
  handle->filename = (char *)0x0;
  handle->flags = uVar2 & 0xffffbfff;
  if ((uVar2 >> 0xd & 1) != 0) {
    puVar1 = &loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  pvVar3 = handle->watchers[0];
  *(void **)handle->watchers[1] = pvVar3;
  *(void **)((long)pvVar3 + 8) = handle->watchers[1];
  if (__ptr->watchers != (void **)__ptr->watchers[0]) {
    return 0;
  }
  ppvVar7 = &handle->loop->inotify_watchers;
  pwVar12 = (__ptr->entry).rbe_left;
  pwVar8 = (__ptr->entry).rbe_right;
  if (pwVar12 == (watcher_list *)0x0) {
    pwVar9 = (__ptr->entry).rbe_parent;
    iVar11 = (__ptr->entry).rbe_color;
    if (pwVar8 != (watcher_list *)0x0) goto LAB_00113b4e;
    pwVar8 = (watcher_list *)0x0;
  }
  else {
    if (pwVar8 != (watcher_list *)0x0) {
      do {
        pwVar12 = pwVar8;
        pwVar8 = (pwVar12->entry).rbe_left;
      } while (pwVar8 != (watcher_list *)0x0);
      pwVar8 = (pwVar12->entry).rbe_right;
      pwVar9 = (pwVar12->entry).rbe_parent;
      iVar11 = (pwVar12->entry).rbe_color;
      if (pwVar8 != (watcher_list *)0x0) {
        (pwVar8->entry).rbe_parent = pwVar9;
      }
      ppvVar13 = ppvVar7;
      if (pwVar9 != (watcher_list *)0x0) {
        ppvVar13 = pwVar9->watchers + ((ulong)((pwVar9->entry).rbe_left != pwVar12) - 4);
      }
      *ppvVar13 = pwVar8;
      if ((pwVar12->entry).rbe_parent == __ptr) {
        pwVar9 = pwVar12;
      }
      pwVar14 = (__ptr->entry).rbe_left;
      pwVar10 = (__ptr->entry).rbe_right;
      iVar4 = (__ptr->entry).rbe_color;
      uVar5 = *(undefined4 *)&(__ptr->entry).field_0x1c;
      (pwVar12->entry).rbe_parent = (__ptr->entry).rbe_parent;
      (pwVar12->entry).rbe_color = iVar4;
      *(undefined4 *)&(pwVar12->entry).field_0x1c = uVar5;
      (pwVar12->entry).rbe_left = pwVar14;
      (pwVar12->entry).rbe_right = pwVar10;
      pwVar14 = (__ptr->entry).rbe_parent;
      ppvVar13 = ppvVar7;
      if (pwVar14 != (watcher_list *)0x0) {
        ppvVar13 = pwVar14->watchers + ((ulong)((pwVar14->entry).rbe_left != __ptr) - 4);
      }
      *ppvVar13 = pwVar12;
      (((__ptr->entry).rbe_left)->entry).rbe_parent = pwVar12;
      pwVar14 = (__ptr->entry).rbe_right;
      if (pwVar14 != (watcher_list *)0x0) {
        (pwVar14->entry).rbe_parent = pwVar12;
      }
      goto LAB_00113b6e;
    }
    pwVar9 = (__ptr->entry).rbe_parent;
    iVar11 = (__ptr->entry).rbe_color;
    pwVar8 = pwVar12;
LAB_00113b4e:
    (pwVar8->entry).rbe_parent = pwVar9;
  }
  ppvVar13 = ppvVar7;
  if (pwVar9 != (watcher_list *)0x0) {
    ppvVar13 = pwVar9->watchers + ((ulong)((pwVar9->entry).rbe_left != __ptr) - 4);
  }
  *ppvVar13 = pwVar8;
LAB_00113b6e:
  if (iVar11 == 0) {
    while( true ) {
      if ((pwVar8 != (watcher_list *)0x0) && ((pwVar8->entry).rbe_color != 0)) goto LAB_00113e12;
      pwVar12 = (watcher_list *)*ppvVar7;
      if (pwVar8 == pwVar12) goto LAB_00113e0d;
      pwVar14 = (pwVar9->entry).rbe_left;
      if (pwVar14 == pwVar8) {
        pwVar8 = (pwVar9->entry).rbe_right;
        pwVar10 = pwVar8;
        if ((pwVar8->entry).rbe_color == 1) {
          (pwVar8->entry).rbe_color = 0;
          (pwVar9->entry).rbe_color = 1;
          pwVar10 = (pwVar8->entry).rbe_left;
          (pwVar9->entry).rbe_right = pwVar10;
          if (pwVar10 != (watcher_list *)0x0) {
            (pwVar10->entry).rbe_parent = pwVar9;
          }
          pwVar14 = (pwVar9->entry).rbe_parent;
          (pwVar8->entry).rbe_parent = pwVar14;
          if (pwVar14 == (watcher_list *)0x0) {
            *ppvVar7 = pwVar8;
            pwVar12 = pwVar8;
          }
          else if (pwVar9 == (pwVar14->entry).rbe_left) {
            (pwVar14->entry).rbe_left = pwVar8;
          }
          else {
            (pwVar14->entry).rbe_right = pwVar8;
            pwVar10 = (pwVar9->entry).rbe_right;
          }
          (pwVar8->entry).rbe_left = pwVar9;
          (pwVar9->entry).rbe_parent = pwVar8;
        }
        pwVar8 = (pwVar10->entry).rbe_left;
        if ((pwVar8 == (watcher_list *)0x0) || ((pwVar8->entry).rbe_color == 0)) {
          pwVar14 = (pwVar10->entry).rbe_right;
          if ((pwVar14 == (watcher_list *)0x0) || ((pwVar14->entry).rbe_color == 0))
          goto LAB_00113c7d;
        }
        else {
          pwVar14 = (pwVar10->entry).rbe_right;
          if ((pwVar14 == (watcher_list *)0x0) || ((pwVar14->entry).rbe_color == 0)) {
            (pwVar8->entry).rbe_color = 0;
            (pwVar10->entry).rbe_color = 1;
            pwVar14 = (pwVar8->entry).rbe_right;
            (pwVar10->entry).rbe_left = pwVar14;
            if (pwVar14 != (watcher_list *)0x0) {
              (pwVar14->entry).rbe_parent = pwVar10;
            }
            pwVar14 = (pwVar10->entry).rbe_parent;
            (pwVar8->entry).rbe_parent = pwVar14;
            pwVar6 = pwVar8;
            ppvVar13 = ppvVar7;
            if (pwVar14 != (watcher_list *)0x0) {
              ppvVar13 = pwVar14->watchers + ((ulong)(pwVar10 != (pwVar14->entry).rbe_left) - 4);
              pwVar6 = pwVar12;
            }
            pwVar12 = pwVar6;
            *ppvVar13 = pwVar8;
            (pwVar8->entry).rbe_right = pwVar10;
            (pwVar10->entry).rbe_parent = pwVar8;
            pwVar10 = (pwVar9->entry).rbe_right;
            pwVar14 = (pwVar10->entry).rbe_right;
          }
        }
        (pwVar10->entry).rbe_color = (pwVar9->entry).rbe_color;
        (pwVar9->entry).rbe_color = 0;
        if (pwVar14 != (watcher_list *)0x0) {
          (pwVar14->entry).rbe_color = 0;
        }
        pwVar8 = (pwVar10->entry).rbe_left;
        (pwVar9->entry).rbe_right = pwVar8;
        if (pwVar8 != (watcher_list *)0x0) {
          (pwVar8->entry).rbe_parent = pwVar9;
        }
        pwVar14 = (pwVar9->entry).rbe_parent;
        (pwVar10->entry).rbe_parent = pwVar14;
        pwVar8 = pwVar10;
        if (pwVar14 != (watcher_list *)0x0) {
          ppvVar7 = pwVar14->watchers + ((ulong)(pwVar9 != (pwVar14->entry).rbe_left) - 4);
          pwVar8 = pwVar12;
        }
        *ppvVar7 = pwVar10;
        (pwVar10->entry).rbe_left = pwVar9;
        goto LAB_00113e09;
      }
      pwVar10 = pwVar14;
      if ((pwVar14->entry).rbe_color == 1) {
        (pwVar14->entry).rbe_color = 0;
        (pwVar9->entry).rbe_color = 1;
        pwVar10 = (pwVar14->entry).rbe_right;
        (pwVar9->entry).rbe_left = pwVar10;
        if (pwVar10 != (watcher_list *)0x0) {
          (pwVar10->entry).rbe_parent = pwVar9;
        }
        pwVar8 = (pwVar9->entry).rbe_parent;
        (pwVar14->entry).rbe_parent = pwVar8;
        if (pwVar8 == (watcher_list *)0x0) {
          *ppvVar7 = pwVar14;
          pwVar12 = pwVar14;
        }
        else if (pwVar9 == (pwVar8->entry).rbe_left) {
          (pwVar8->entry).rbe_left = pwVar14;
          pwVar10 = (pwVar9->entry).rbe_left;
        }
        else {
          (pwVar8->entry).rbe_right = pwVar14;
        }
        (pwVar14->entry).rbe_right = pwVar9;
        (pwVar9->entry).rbe_parent = pwVar14;
      }
      pwVar8 = (pwVar10->entry).rbe_left;
      if ((pwVar8 != (watcher_list *)0x0) && ((pwVar8->entry).rbe_color != 0)) goto LAB_00113d0c;
      pwVar14 = (pwVar10->entry).rbe_right;
      if ((pwVar14 != (watcher_list *)0x0) && ((pwVar14->entry).rbe_color != 0)) break;
LAB_00113c7d:
      (pwVar10->entry).rbe_color = 1;
      pwVar8 = pwVar9;
      pwVar9 = (pwVar9->entry).rbe_parent;
    }
    if ((pwVar8 == (watcher_list *)0x0) || ((pwVar8->entry).rbe_color == 0)) {
      (pwVar14->entry).rbe_color = 0;
      (pwVar10->entry).rbe_color = 1;
      pwVar8 = (pwVar14->entry).rbe_left;
      (pwVar10->entry).rbe_right = pwVar8;
      if (pwVar8 != (watcher_list *)0x0) {
        (pwVar8->entry).rbe_parent = pwVar10;
      }
      pwVar8 = (pwVar10->entry).rbe_parent;
      (pwVar14->entry).rbe_parent = pwVar8;
      pwVar6 = pwVar14;
      ppvVar13 = ppvVar7;
      if (pwVar8 != (watcher_list *)0x0) {
        ppvVar13 = pwVar8->watchers + ((ulong)(pwVar10 != (pwVar8->entry).rbe_left) - 4);
        pwVar6 = pwVar12;
      }
      pwVar12 = pwVar6;
      *ppvVar13 = pwVar14;
      (pwVar14->entry).rbe_left = pwVar10;
      (pwVar10->entry).rbe_parent = pwVar14;
      pwVar10 = (pwVar9->entry).rbe_left;
      pwVar8 = (pwVar10->entry).rbe_left;
    }
LAB_00113d0c:
    (pwVar10->entry).rbe_color = (pwVar9->entry).rbe_color;
    (pwVar9->entry).rbe_color = 0;
    if (pwVar8 != (watcher_list *)0x0) {
      (pwVar8->entry).rbe_color = 0;
    }
    pwVar8 = (pwVar10->entry).rbe_right;
    (pwVar9->entry).rbe_left = pwVar8;
    if (pwVar8 != (watcher_list *)0x0) {
      (pwVar8->entry).rbe_parent = pwVar9;
    }
    pwVar14 = (pwVar9->entry).rbe_parent;
    (pwVar10->entry).rbe_parent = pwVar14;
    pwVar8 = pwVar10;
    if (pwVar14 != (watcher_list *)0x0) {
      ppvVar7 = pwVar14->watchers + ((ulong)(pwVar9 != (pwVar14->entry).rbe_left) - 4);
      pwVar8 = pwVar12;
    }
    *ppvVar7 = pwVar10;
    (pwVar10->entry).rbe_right = pwVar9;
LAB_00113e09:
    (pwVar9->entry).rbe_parent = pwVar10;
LAB_00113e0d:
    if (pwVar8 != (watcher_list *)0x0) {
LAB_00113e12:
      (pwVar8->entry).rbe_color = 0;
    }
  }
  uv__inotify_rm_watch(handle->loop->inotify_fd,__ptr->wd);
  free(__ptr);
  return 0;
}

Assistant:

int uv_fs_event_stop(uv_fs_event_t* handle) {
  struct watcher_list* w;

  if (!uv__is_active(handle))
    return -EINVAL;

  w = find_watcher(handle->loop, handle->wd);
  assert(w != NULL);

  handle->wd = -1;
  handle->filename = NULL;
  uv__handle_stop(handle);
  QUEUE_REMOVE(&handle->watchers);

  if (QUEUE_EMPTY(&w->watchers)) {
    /* No watchers left for this path. Clean up. */
    RB_REMOVE(watcher_root, CAST(&handle->loop->inotify_watchers), w);
    uv__inotify_rm_watch(handle->loop->inotify_fd, w->wd);
    free(w);
  }

  return 0;
}